

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

char * Smt_VecEntryName(Smt_Prs_t *p,Vec_Int_t *vFans,int i)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = Vec_IntEntry(vFans,i);
  iVar1 = Abc_LitIsCompl(iVar1);
  if (iVar1 != 0) {
    iVar1 = Vec_IntEntry(vFans,i);
    pcVar2 = Smt_EntryName(p,iVar1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static inline char *      Smt_VecEntryName( Smt_Prs_t * p, Vec_Int_t * vFans, int i )         { return Smt_EntryIsName(Vec_IntEntry(vFans, i)) ? Smt_EntryName(p, Vec_IntEntry(vFans, i)) : NULL;                          }